

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc64ad.c
# Opt level: O0

int_t mc64bd_(int_t *n,int_t *ne,int_t *ip,int_t *irn,double *a,int *iperm,int_t *num,int_t *jperm,
             int_t *pr,int_t *q,int_t *l,double *d__)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double rinf;
  int_t jdum;
  int_t idum;
  int_t qlen;
  int_t jord;
  double dnew;
  int local_d0;
  int_t low;
  int_t jsp;
  int_t isp;
  double csp;
  int_t kk2;
  int_t kk1;
  double dq0;
  double dStack_a8;
  int_t up;
  double bv;
  int local_98;
  int_t kk;
  int_t jj;
  int_t ii;
  double di;
  double ai;
  int_t q0;
  int_t i0;
  double a0;
  int_t k;
  int_t j;
  int_t i__;
  int_t c__1;
  double d__3;
  double d__2;
  double d__1;
  int local_40;
  int_t i__3;
  int_t i__2;
  int_t i__1;
  int *iperm_local;
  double *a_local;
  int_t *irn_local;
  int_t *ip_local;
  int_t *ne_local;
  int_t *n_local;
  
  j = 1;
  _i__2 = iperm + -1;
  irn_local = ip + -1;
  iperm_local = (int *)(a + -1);
  a_local = (double *)(irn + -1);
  ip_local = ne;
  ne_local = n;
  dStack_a8 = dmach("Overflow");
  *num = 0;
  iVar1 = *ne_local;
  for (a0._0_4_ = 1; a0._0_4_ <= iVar1; a0._0_4_ = a0._0_4_ + 1) {
    _i__2[a0._0_4_] = 0;
    jperm[(long)a0._0_4_ + -1] = 0;
    pr[(long)a0._0_4_ + -1] = irn_local[a0._0_4_];
    d__[(long)a0._0_4_ + -1] = 0.0;
  }
  iVar1 = *ne_local;
  for (a0._4_4_ = 1; a0._4_4_ <= iVar1; a0._4_4_ = a0._4_4_ + 1) {
    _q0 = -1.0;
    iVar2 = irn_local[a0._4_4_ + 1];
    for (a0._0_4_ = irn_local[a0._4_4_]; a0._0_4_ <= iVar2 + -1; a0._0_4_ = a0._0_4_ + 1) {
      iVar3 = *(int *)((long)a_local + (long)a0._0_4_ * 4);
      d__2 = *(double *)(iperm_local + (long)a0._0_4_ * 2);
      local_100 = d__2;
      if (d__2 < 0.0) {
        local_100 = -d__2;
      }
      di = local_100;
      if (d__[(long)iVar3 + -1] <= local_100 && local_100 != d__[(long)iVar3 + -1]) {
        d__[(long)iVar3 + -1] = local_100;
      }
      if (jperm[(long)a0._4_4_ + -1] == 0) {
        if (local_100 < dStack_a8) {
          if (_q0 < local_100) {
            _q0 = local_100;
            ai._4_4_ = iVar3;
          }
        }
        else {
          _q0 = dStack_a8;
          if (_i__2[iVar3] == 0) {
            jperm[(long)a0._4_4_ + -1] = iVar3;
            _i__2[iVar3] = a0._4_4_;
            *num = *num + 1;
          }
        }
      }
    }
    if ((((_q0 != -1.0) || (NAN(_q0))) && (_q0 < dStack_a8)) &&
       (dStack_a8 = _q0, _i__2[ai._4_4_] == 0)) {
      _i__2[ai._4_4_] = a0._4_4_;
      jperm[(long)a0._4_4_ + -1] = ai._4_4_;
      *num = *num + 1;
    }
  }
  for (k = 1; k <= *ne_local; k = k + 1) {
    d__2 = dStack_a8;
    d__3 = d__[(long)k + -1];
    local_108 = d__3;
    if (dStack_a8 < d__3) {
      local_108 = dStack_a8;
    }
    dStack_a8 = local_108;
  }
  if (*num != *ne_local) {
    iVar1 = *ne_local;
    for (a0._4_4_ = 1; a0._4_4_ <= iVar1; a0._4_4_ = a0._4_4_ + 1) {
      if (jperm[(long)a0._4_4_ + -1] == 0) {
        iVar2 = irn_local[a0._4_4_ + 1];
        for (a0._0_4_ = irn_local[a0._4_4_]; a0._0_4_ <= iVar2 + -1; a0._0_4_ = a0._0_4_ + 1) {
          iVar3 = *(int *)((long)a_local + (long)a0._0_4_ * 4);
          d__2 = *(double *)(iperm_local + (long)a0._0_4_ * 2);
          local_110 = d__2;
          if (d__2 < 0.0) {
            local_110 = -d__2;
          }
          di = local_110;
          if (dStack_a8 <= local_110) {
            if (_i__2[iVar3] == 0) {
LAB_0011fb3b:
              *num = *num + 1;
              jperm[(long)a0._4_4_ + -1] = iVar3;
              _i__2[iVar3] = a0._4_4_;
              pr[(long)a0._4_4_ + -1] = a0._0_4_ + 1;
              break;
            }
            local_98 = _i__2[iVar3];
            csp._4_4_ = pr[(long)local_98 + -1];
            csp._0_4_ = irn_local[local_98 + 1] + -1;
            iVar4 = csp._4_4_;
            if (csp._4_4_ <= csp._0_4_) {
              while (bv._4_4_ = iVar4, d__1._4_4_ = csp._0_4_, bv._4_4_ <= csp._0_4_) {
                kk = *(int *)((long)a_local + (long)bv._4_4_ * 4);
                if (_i__2[kk] == 0) {
                  d__2 = *(double *)(iperm_local + (long)bv._4_4_ * 2);
                  local_118 = d__2;
                  if (d__2 < 0.0) {
                    local_118 = -d__2;
                  }
                  if (dStack_a8 <= local_118) {
                    jperm[(long)local_98 + -1] = kk;
                    _i__2[kk] = local_98;
                    pr[(long)local_98 + -1] = bv._4_4_ + 1;
                    goto LAB_0011fb3b;
                  }
                }
                iVar4 = bv._4_4_ + 1;
              }
              pr[(long)local_98 + -1] = irn_local[local_98 + 1];
            }
          }
        }
      }
    }
    if (*num != *ne_local) {
      iVar1 = *ne_local;
      for (k = 1; k <= iVar1; k = k + 1) {
        d__[(long)k + -1] = -1.0;
        l[(long)k + -1] = 0;
      }
      i__3 = *ne_local;
      for (idum = 1; idum <= i__3; idum = idum + 1) {
        if (jperm[(long)idum + -1] == 0) {
          jdum = 0;
          dnew._4_4_ = *ne_local + 1;
          dq0._4_4_ = *ne_local + 1;
          _jsp = -1.0;
          a0._4_4_ = idum;
          pr[(long)idum + -1] = -1;
          local_40 = irn_local[idum + 1] + -1;
          for (a0._0_4_ = irn_local[idum]; a0._0_4_ <= local_40; a0._0_4_ = a0._0_4_ + 1) {
            k = *(int *)((long)a_local + (long)a0._0_4_ * 4);
            d__2 = *(double *)(iperm_local + (long)a0._0_4_ * 2);
            local_120 = d__2;
            if (d__2 < 0.0) {
              local_120 = -d__2;
            }
            _qlen = local_120;
            if (_jsp < local_120) {
              if (_i__2[k] == 0) {
                _jsp = local_120;
                local_d0 = a0._4_4_;
                low = k;
                if (dStack_a8 <= local_120) goto LAB_001202cb;
              }
              else {
                d__[(long)k + -1] = local_120;
                if (local_120 < dStack_a8) {
                  jdum = jdum + 1;
                  l[(long)k + -1] = jdum;
                  mc64dd_(&k,ne_local,q,d__,l,&j);
                }
                else {
                  dnew._4_4_ = dnew._4_4_ + -1;
                  q[(long)dnew._4_4_ + -1] = k;
                }
                local_98 = _i__2[k];
                pr[(long)local_98 + -1] = a0._4_4_;
              }
            }
          }
          local_40 = *num;
          for (rinf._0_4_ = 1; rinf._0_4_ <= local_40; rinf._0_4_ = rinf._0_4_ + 1) {
            if (dnew._4_4_ == dq0._4_4_) {
              if ((jdum == 0) || (k = *q, d__[(long)k + -1] <= _jsp)) break;
              dStack_a8 = d__[(long)k + -1];
              d__1._4_4_ = *ne_local;
              for (rinf._4_4_ = 1; rinf._4_4_ <= d__1._4_4_; rinf._4_4_ = rinf._4_4_ + 1) {
                mc64ed_(&jdum,ne_local,q,d__,l,&j);
                l[(long)k + -1] = 0;
                dnew._4_4_ = dnew._4_4_ + -1;
                q[(long)dnew._4_4_ + -1] = k;
                if (jdum == 0) break;
                k = *q;
                if ((d__[(long)k + -1] != dStack_a8) || (NAN(d__[(long)k + -1]) || NAN(dStack_a8)))
                break;
              }
            }
            dq0._4_4_ = dq0._4_4_ + -1;
            ai._0_4_ = q[(long)dq0._4_4_ + -1];
            _kk2 = d__[(long)ai._0_4_ + -1];
            l[(long)ai._0_4_ + -1] = dq0._4_4_;
            a0._4_4_ = _i__2[ai._0_4_];
            d__1._4_4_ = irn_local[a0._4_4_ + 1] + -1;
            for (a0._0_4_ = irn_local[a0._4_4_]; a0._0_4_ <= d__1._4_4_; a0._0_4_ = a0._0_4_ + 1) {
              k = *(int *)((long)a_local + (long)a0._0_4_ * 4);
              if (l[(long)k + -1] < dq0._4_4_) {
                d__3 = _kk2;
                d__2 = *(double *)(iperm_local + (long)a0._0_4_ * 2);
                local_128 = d__2;
                if (d__2 < 0.0) {
                  local_128 = -d__2;
                }
                _i__ = local_128;
                if (local_128 <= _kk2) {
                  local_130 = local_128;
                }
                else {
                  local_130 = _kk2;
                }
                _qlen = local_130;
                if (_jsp < local_130) {
                  if (_i__2[k] == 0) {
                    _jsp = local_130;
                    local_d0 = a0._4_4_;
                    low = k;
                    if (dStack_a8 <= local_130) goto LAB_001202cb;
                  }
                  else {
                    _jj = d__[(long)k + -1];
                    if ((_jj < dStack_a8) && (_jj < local_130)) {
                      d__[(long)k + -1] = local_130;
                      if (local_130 < dStack_a8) {
                        if ((_jj == -1.0) && (!NAN(_jj))) {
                          jdum = jdum + 1;
                          l[(long)k + -1] = jdum;
                        }
                        mc64dd_(&k,ne_local,q,d__,l,&j);
                      }
                      else {
                        if ((_jj != -1.0) || (NAN(_jj))) {
                          mc64fd_(l + (long)k + -1,&jdum,ne_local,q,d__,l,&j);
                        }
                        l[(long)k + -1] = 0;
                        dnew._4_4_ = dnew._4_4_ + -1;
                        q[(long)dnew._4_4_ + -1] = k;
                      }
                      local_98 = _i__2[k];
                      pr[(long)local_98 + -1] = a0._4_4_;
                    }
                  }
                }
              }
            }
          }
LAB_001202cb:
          if ((_jsp != -1.0) || (NAN(_jsp))) {
            if (_jsp <= dStack_a8) {
              local_138 = _jsp;
            }
            else {
              local_138 = dStack_a8;
            }
            dStack_a8 = local_138;
            *num = *num + 1;
            k = low;
            a0._4_4_ = local_d0;
            iVar1 = *num;
            for (rinf._0_4_ = 1; rinf._0_4_ <= iVar1 + 1; rinf._0_4_ = rinf._0_4_ + 1) {
              ai._4_4_ = jperm[(long)a0._4_4_ + -1];
              jperm[(long)a0._4_4_ + -1] = k;
              _i__2[k] = a0._4_4_;
              a0._4_4_ = pr[(long)a0._4_4_ + -1];
              if (a0._4_4_ == -1) break;
              k = ai._4_4_;
            }
          }
          iVar1 = *ne_local;
          for (bv._4_4_ = dq0._4_4_; bv._4_4_ <= iVar1; bv._4_4_ = bv._4_4_ + 1) {
            iVar2 = q[(long)bv._4_4_ + -1];
            d__[(long)iVar2 + -1] = -1.0;
            l[(long)iVar2 + -1] = 0;
          }
          for (bv._4_4_ = dnew._4_4_; bv._4_4_ <= dq0._4_4_ + -1; bv._4_4_ = bv._4_4_ + 1) {
            d__[(long)q[(long)bv._4_4_ + -1] + -1] = -1.0;
          }
          for (bv._4_4_ = 1; bv._4_4_ <= jdum; bv._4_4_ = bv._4_4_ + 1) {
            iVar1 = q[(long)bv._4_4_ + -1];
            d__[(long)iVar1 + -1] = -1.0;
            l[(long)iVar1 + -1] = 0;
          }
        }
      }
      if (*num != *ne_local) {
        iVar1 = *ne_local;
        for (a0._4_4_ = 1; a0._4_4_ <= iVar1; a0._4_4_ = a0._4_4_ + 1) {
          jperm[(long)a0._4_4_ + -1] = 0;
        }
        a0._0_4_ = 0;
        iVar1 = *ne_local;
        for (k = 1; k <= iVar1; k = k + 1) {
          if (_i__2[k] == 0) {
            a0._0_4_ = a0._0_4_ + 1;
            pr[(long)a0._0_4_ + -1] = k;
          }
          else {
            jperm[(long)_i__2[k] + -1] = k;
          }
        }
        a0._0_4_ = 0;
        iVar1 = *ne_local;
        for (k = 1; k <= iVar1; k = k + 1) {
          if (jperm[(long)k + -1] == 0) {
            a0._0_4_ = a0._0_4_ + 1;
            _i__2[pr[(long)a0._0_4_ + -1]] = k;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int_t mc64bd_(int_t *n, int_t *ne, int_t *ip, int_t *
	irn, double *a, int *iperm, int_t *num, int_t *jperm, 
	int_t *pr, int_t *q, int_t *l, double *d__)
{
    /* System generated locals */
    int_t i__1, i__2, i__3;
    double d__1, d__2, d__3;
    int_t c__1 = 1;

    /* Local variables */
    int_t i__, j, k;
    double a0;
    int_t i0, q0;
    double ai, di;
    int_t ii, jj, kk;
    double bv;
    int_t up;
    double dq0;
    int_t kk1, kk2;
    double csp;
    int_t isp, jsp, low;
    double dnew;
    int_t jord, qlen, idum, jdum;
    double rinf;
    extern /* Subroutine */ int_t
	mc64dd_(int_t *, int_t *, int_t *, double *, int_t *, int_t *),
	mc64ed_(int_t *, int_t *, int_t *, double *, int_t *, int_t *),
	mc64fd_(int_t *, int_t *, int_t *, int_t *, double *, int_t *, int_t *);


/* *** Copyright (c) 1999  Council for the Central Laboratory of the */
/*     Research Councils                                             *** */
/* *** Although every effort has been made to ensure robustness and  *** */
/* *** reliability of the subroutines in this MC64 suite, we         *** */
/* *** disclaim any liability arising through the use or misuse of   *** */
/* *** any of the subroutines.                                       *** */
/* *** Any problems?   Contact ... */
/*     Iain Duff (I.Duff@rl.ac.uk) or Jacko Koster (jak@ii.uib.no)   *** */

/* N, NE, IP, IRN are described in MC64A/AD. */
/* A is a REAL (DOUBLE PRECISION in the D-version) array of length */
/*   NE. A(K), K=1..NE, must be set to the value of the entry */
/*   that corresponds to IRN(K). It is not altered. */
/* IPERM is an INT_T array of length N. On exit, it contains the */
/*    matching: IPERM(I) = 0 or row I is matched to column IPERM(I). */
/* NUM is INT_T variable. On exit, it contains the cardinality of the */
/*    matching stored in IPERM. */
/* IW is an INT_T work array of length 4N. */
/* DW is a REAL (DOUBLE PRECISION in D-version) work array of length N. */
/* Local variables */
/* Local parameters */
/* Intrinsic functions */
/* External subroutines and/or functions */
/*      EXTERNAL FD05AD,MC64DD,MC64ED,MC64FD, DMACH */
/*      DOUBLE PRECISION FD05AD, DMACH */
/* Set RINF to largest positive real number */
/* XSL  RINF = FD05AD(5) */
    /* Parameter adjustments */
    --d__;
    --l;
    --q;
    --pr;
    --jperm;
    --iperm;
    --ip;
    --a;
    --irn;

    /* Function Body */
    rinf = dmach("Overflow");
/* Initialization */
    *num = 0;
    bv = rinf;
    i__1 = *n;
    for (k = 1; k <= i__1; ++k) {
	iperm[k] = 0;
	jperm[k] = 0;
	pr[k] = ip[k];
	d__[k] = 0.;
/* L10: */
    }
/* Scan columns of matrix; */
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	a0 = -1.;
	i__2 = ip[j + 1] - 1;
	for (k = ip[j]; k <= i__2; ++k) {
	    i__ = irn[k];
	    ai = (d__1 = a[k], abs(d__1));
	    if (ai > d__[i__]) {
		d__[i__] = ai;
	    }
	    if (jperm[j] != 0) {
		goto L30;
	    }
	    if (ai >= bv) {
		a0 = bv;
		if (iperm[i__] != 0) {
		    goto L30;
		}
		jperm[j] = i__;
		iperm[i__] = j;
		++(*num);
	    } else {
		if (ai <= a0) {
		    goto L30;
		}
		a0 = ai;
		i0 = i__;
	    }
L30:
	    ;
	}
	if (a0 != -1. && a0 < bv) {
	    bv = a0;
	    if (iperm[i0] != 0) {
		goto L20;
	    }
	    iperm[i0] = j;
	    jperm[j] = i0;
	    ++(*num);
	}
L20:
	;
    }
/* Update BV with smallest of all the largest maximum absolute values */
/* of the rows. */
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
/* Computing MIN */
	d__1 = bv, d__2 = d__[i__];
	bv = min(d__1,d__2);
/* L25: */
    }
    if (*num == *n) {
	goto L1000;
    }
/* Rescan unassigned columns; improve initial assignment */
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	if (jperm[j] != 0) {
	    goto L95;
	}
	i__2 = ip[j + 1] - 1;
	for (k = ip[j]; k <= i__2; ++k) {
	    i__ = irn[k];
	    ai = (d__1 = a[k], abs(d__1));
	    if (ai < bv) {
		goto L50;
	    }
	    if (iperm[i__] == 0) {
		goto L90;
	    }
	    jj = iperm[i__];
	    kk1 = pr[jj];
	    kk2 = ip[jj + 1] - 1;
	    if (kk1 > kk2) {
		goto L50;
	    }
	    i__3 = kk2;
	    for (kk = kk1; kk <= i__3; ++kk) {
		ii = irn[kk];
		if (iperm[ii] != 0) {
		    goto L70;
		}
		if ((d__1 = a[kk], abs(d__1)) >= bv) {
		    goto L80;
		}
L70:
		;
	    }
	    pr[jj] = kk2 + 1;
L50:
	    ;
	}
	goto L95;
L80:
	jperm[jj] = ii;
	iperm[ii] = jj;
	pr[jj] = kk + 1;
L90:
	++(*num);
	jperm[j] = i__;
	iperm[i__] = j;
	pr[j] = k + 1;
L95:
	;
    }
    if (*num == *n) {
	goto L1000;
    }
/* Prepare for main loop */
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	d__[i__] = -1.;
	l[i__] = 0;
/* L99: */
    }
/* Main loop ... each pass round this loop is similar to Dijkstra's */
/* algorithm for solving the single source shortest path problem */
    i__1 = *n;
    for (jord = 1; jord <= i__1; ++jord) {
	if (jperm[jord] != 0) {
	    goto L100;
	}
	qlen = 0;
	low = *n + 1;
	up = *n + 1;
/* CSP is cost of shortest path to any unassigned row */
/* ISP is matrix position of unassigned row element in shortest path */
/* JSP is column index of unassigned row element in shortest path */
	csp = -1.;
/* Build shortest path tree starting from unassigned column JORD */
	j = jord;
	pr[j] = -1;
/* Scan column J */
	i__2 = ip[j + 1] - 1;
	for (k = ip[j]; k <= i__2; ++k) {
	    i__ = irn[k];
	    dnew = (d__1 = a[k], abs(d__1));
	    if (csp >= dnew) {
		goto L115;
	    }
	    if (iperm[i__] == 0) {
/* Row I is unassigned; update shortest path info */
		csp = dnew;
		isp = i__;
		jsp = j;
		if (csp >= bv) {
		    goto L160;
		}
	    } else {
		d__[i__] = dnew;
		if (dnew >= bv) {
/* Add row I to Q2 */
		    --low;
		    q[low] = i__;
		} else {
/* Add row I to Q, and push it */
		    ++qlen;
		    l[i__] = qlen;
		    mc64dd_(&i__, n, &q[1], &d__[1], &l[1], &c__1);
		}
		jj = iperm[i__];
		pr[jj] = j;
	    }
L115:
	    ;
	}
	i__2 = *num;
	for (jdum = 1; jdum <= i__2; ++jdum) {
/* If Q2 is empty, extract new rows from Q */
	    if (low == up) {
		if (qlen == 0) {
		    goto L160;
		}
		i__ = q[1];
		if (csp >= d__[i__]) {
		    goto L160;
		}
		bv = d__[i__];
		i__3 = *n;
		for (idum = 1; idum <= i__3; ++idum) {
		    mc64ed_(&qlen, n, &q[1], &d__[1], &l[1], &c__1);
		    l[i__] = 0;
		    --low;
		    q[low] = i__;
		    if (qlen == 0) {
			goto L153;
		    }
		    i__ = q[1];
		    if (d__[i__] != bv) {
			goto L153;
		    }
/* L152: */
		}
/* End of dummy loop; this point is never reached */
	    }
/* Move row Q0 */
L153:
	    --up;
	    q0 = q[up];
	    dq0 = d__[q0];
	    l[q0] = up;
/* Scan column that matches with row Q0 */
	    j = iperm[q0];
	    i__3 = ip[j + 1] - 1;
	    for (k = ip[j]; k <= i__3; ++k) {
		i__ = irn[k];
/* Update D(I) */
		if (l[i__] >= up) {
		    goto L155;
		}
/* Computing MIN */
		d__2 = dq0, d__3 = (d__1 = a[k], abs(d__1));
		dnew = min(d__2,d__3);
		if (csp >= dnew) {
		    goto L155;
		}
		if (iperm[i__] == 0) {
/* Row I is unassigned; update shortest path info */
		    csp = dnew;
		    isp = i__;
		    jsp = j;
		    if (csp >= bv) {
			goto L160;
		    }
		} else {
		    di = d__[i__];
		    if (di >= bv || di >= dnew) {
			goto L155;
		    }
		    d__[i__] = dnew;
		    if (dnew >= bv) {
/* Delete row I from Q (if necessary); add row I to Q2 */
			if (di != -1.) {
			    mc64fd_(&l[i__], &qlen, n, &q[1], &d__[1], &l[1], 
				    &c__1);
			}
			l[i__] = 0;
			--low;
			q[low] = i__;
		    } else {
/* Add row I to Q (if necessary); push row I up Q */
			if (di == -1.) {
			    ++qlen;
			    l[i__] = qlen;
			}
			mc64dd_(&i__, n, &q[1], &d__[1], &l[1], &c__1);
		    }
/* Update tree */
		    jj = iperm[i__];
		    pr[jj] = j;
		}
L155:
		;
	    }
/* L150: */
	}
/* If CSP = MINONE, no augmenting path is found */
L160:
	if (csp == -1.) {
	    goto L190;
	}
/* Update bottleneck value */
	bv = min(bv,csp);
/* Find augmenting path by tracing backward in PR; update IPERM,JPERM */
	++(*num);
	i__ = isp;
	j = jsp;
	i__2 = *num + 1;
	for (jdum = 1; jdum <= i__2; ++jdum) {
	    i0 = jperm[j];
	    jperm[j] = i__;
	    iperm[i__] = j;
	    j = pr[j];
	    if (j == -1) {
		goto L190;
	    }
	    i__ = i0;
/* L170: */
	}
/* End of dummy loop; this point is never reached */
L190:
	i__2 = *n;
	for (kk = up; kk <= i__2; ++kk) {
	    i__ = q[kk];
	    d__[i__] = -1.;
	    l[i__] = 0;
/* L191: */
	}
	i__2 = up - 1;
	for (kk = low; kk <= i__2; ++kk) {
	    i__ = q[kk];
	    d__[i__] = -1.;
/* L192: */
	}
	i__2 = qlen;
	for (kk = 1; kk <= i__2; ++kk) {
	    i__ = q[kk];
	    d__[i__] = -1.;
	    l[i__] = 0;
/* L193: */
	}
L100:
	;
    }
/* End of main loop */
/* BV is bottleneck value of final matching */
    if (*num == *n) {
	goto L1000;
    }
/* Matrix is structurally singular, complete IPERM. */
/* JPERM, PR are work arrays */
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	jperm[j] = 0;
/* L300: */
    }
    k = 0;
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	if (iperm[i__] == 0) {
	    ++k;
	    pr[k] = i__;
	} else {
	    j = iperm[i__];
	    jperm[j] = i__;
	}
/* L310: */
    }
    k = 0;
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	if (jperm[i__] != 0) {
	    goto L320;
	}
	++k;
	jdum = pr[k];
	iperm[jdum] = i__;
L320:
	;
    }
L1000:
    return 0;
}